

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O3

int DataManager::getNodeValue(int index,int param,double *value,Network *nw)

{
  int iVar1;
  Node *node;
  double dVar2;
  double extraout_XMM0_Qa;
  undefined8 local_58;
  double dummy;
  double local_48;
  double local_40;
  double local_38;
  
  *value = 0.0;
  if (index < 0) {
    return 0xcd;
  }
  iVar1 = Network::count(nw,NODE);
  if (iVar1 <= index) {
    return 0xcd;
  }
  local_48 = (nw->units).factors[1];
  dummy = (nw->units).factors[4];
  local_38 = (nw->units).factors[5];
  local_40 = (nw->units).factors[8];
  node = Network::node(nw,index);
  local_58 = 0;
  switch(param) {
  case 0:
    local_38 = local_48 * node->elev;
    break;
  case 1:
  case 2:
    goto LAB_00121387;
  case 3:
    (*(node->super_Element)._vptr_Element[7])(node->head,node,&local_58);
    dVar2 = extraout_XMM0_Qa;
    dummy = local_38;
    goto LAB_00121320;
  case 4:
    local_38 = local_40 * node->initQual;
    break;
  case 5:
  case 6:
  case 7:
  case 0xd:
    iVar1 = getQualSourceValue(param,node,value,nw);
    return iVar1;
  default:
    iVar1 = getTankValue(param,node,value,nw);
    return iVar1;
  case 9:
    local_38 = local_38 * node->fullDemand;
    break;
  case 10:
    local_38 = local_48 * node->head;
    break;
  case 0xb:
    dVar2 = node->head - node->elev;
LAB_00121320:
    *value = dummy * dVar2;
    return 0;
  case 0xc:
    local_38 = local_40 * node->quality;
    break;
  case 0x19:
    local_38 = local_38 * node->actualDemand;
    break;
  case 0x1a:
    *value = local_38 * node->outflow;
    iVar1 = (*(node->super_Element)._vptr_Element[2])(node);
    if (iVar1 != 0) {
      *value = -*value;
    }
    goto LAB_00121387;
  }
  *value = local_38;
LAB_00121387:
  return 0;
}

Assistant:

int DataManager::getNodeValue(int index, int param, double* value, Network* nw)
{
    *value = 0.0;
    if ( index < 0 || index >= nw->count(Element::NODE) ) return 205;

    double lcf = nw->ucf(Units::LENGTH);
    double pcf = nw->ucf(Units::PRESSURE);
    double qcf = nw->ucf(Units::FLOW);
    double ccf = nw->ucf(Units::CONCEN);

    Node* node = nw->node(index);
    double dummy = 0.0;
    switch (param)
    {
    case EN_ELEVATION:
        *value = node->elev * lcf;
        break;

    case EN_BASEDEMAND:   break;
    case EN_BASEPATTERN:      break;

    case EN_FULLDEMAND:
        *value = node->fullDemand * qcf;
        break;

    case EN_ACTUALDEMAND:
        *value = node->actualDemand * qcf;
        break;

    case EN_OUTFLOW:
        *value = node->outflow * qcf;
         if ( node->type() != Node::JUNCTION ) *value = -(*value);
         break;

    case EN_EMITTERFLOW:
        *value = node->findEmitterFlow(node->head, dummy) * qcf;
        break;

    case EN_HEAD:
        *value = node->head * lcf;
        break;

    case EN_PRESSURE:
        *value = (node->head - node->elev) * pcf;
        break;

    case EN_INITQUAL:
        *value = node->initQual * ccf;
        break;

    case EN_QUALITY:
        *value = node->quality * ccf;
        break;

    case EN_SOURCEQUAL:
    case EN_SOURCEPAT:
    case EN_SOURCETYPE:
    case EN_SOURCEMASS:
        return getQualSourceValue(param, node, value, nw);

    // ... remaining node parameters apply only to Tanks
    default: return getTankValue(param, node, value, nw);
    }
    return 0;
}